

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::(anonymous_namespace)::formatDuration_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double seconds)

{
  ReusableStringStream *pRVar1;
  _Setprecision local_40 [4];
  undefined1 local_30 [8];
  ReusableStringStream rss;
  double seconds_local;
  
  rss.m_oss = (ostream *)seconds;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_30);
  pRVar1 = ReusableStringStream::operator<<((ReusableStringStream *)local_30,std::fixed);
  local_40[0] = std::setprecision(3);
  pRVar1 = ReusableStringStream::operator<<(pRVar1,local_40);
  ReusableStringStream::operator<<(pRVar1,(double *)&rss.m_oss);
  ReusableStringStream::str_abi_cxx11_(__return_storage_ptr__,(ReusableStringStream *)local_30);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDuration( double seconds ) {
            ReusableStringStream rss;
            rss << std::fixed << std::setprecision( 3 ) << seconds;
            return rss.str();
        }